

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall r_exec::CSTOverlay::inject_production(CSTOverlay *this)

{
  pointer pPVar1;
  _Fact *target;
  ulong after;
  Pred *pPVar2;
  Fact *pFVar3;
  uint64_t uVar4;
  ostream *poVar5;
  uint64_t time_to_live;
  pointer pPVar6;
  __node_base *p_Var7;
  __node_base *p_Var8;
  P<r_exec::_Fact> input;
  
  target = &CSTController::get_f_icst
                      ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,
                       (HLPBindingMap *)(this->super_HLPOverlay).bindings.object,&this->inputs)->
            super__Fact;
  after = (*Now)();
  if ((this->simulations)._M_h._M_element_count != 0) {
    pPVar2 = (Pred *)operator_new(0x180);
    Pred::Pred(pPVar2,target,1.0);
    pFVar3 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)target);
    Fact::Fact(pFVar3,(Code *)pPVar2,after,after,1.0,1.0);
    p_Var7 = &(this->simulations)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::push_back
                (&pPVar2->simulations,(value_type *)(p_Var7 + 1));
    }
    HLPController::inject_prediction
              ((HLPController *)(this->super_HLPOverlay).super_Overlay.controller,pFVar3,
               this->lowest_cfd);
    return;
  }
  uVar4 = BindingMap::get_fwd_before((BindingMap *)(this->super_HLPOverlay).bindings.object);
  time_to_live = 0;
  if (after <= uVar4) {
    time_to_live = uVar4 - after;
  }
  if ((this->predictions)._M_h._M_element_count == 0) {
    CSTController::inject_icst
              ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,(Fact *)target,
               this->lowest_cfd,time_to_live);
    poVar5 = _Mem::Output(CST_OUT);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&input);
    poVar5 = std::operator<<(poVar5,(string *)&input);
    poVar5 = std::operator<<(poVar5,"\t\t\t\t");
    (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[2])(target);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," icst[");
    (*((((this->super_HLPOverlay).super_Overlay.controller)->view->object).object)->_vptr__Object[2]
    )();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"][");
    std::__cxx11::string::~string((string *)&input);
    pPVar1 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar6 = (this->inputs).
                  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1)
    {
      input.object = pPVar6->object;
      if (input.object != (_Object *)0x0) {
        LOCK();
        ((input.object)->refCount).super___atomic_base<long>._M_i =
             ((input.object)->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      poVar5 = _Mem::Output(CST_OUT);
      poVar5 = std::operator<<(poVar5," ");
      (*(input.object)->_vptr__Object[2])();
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      core::P<r_exec::_Fact>::~P(&input);
    }
    poVar5 = _Mem::Output(CST_OUT);
    poVar5 = std::operator<<(poVar5,"]");
  }
  else {
    pPVar2 = (Pred *)operator_new(0x180);
    Pred::Pred(pPVar2,target,1.0);
    pFVar3 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)target);
    Fact::Fact(pFVar3,(Code *)pPVar2,after,after,1.0,1.0);
    p_Var8 = &(this->predictions)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::push_back
                (&pPVar2->grounds,(value_type *)(p_Var8 + 1));
    }
    CSTController::inject_prediction
              ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,pFVar3,
               this->lowest_cfd,time_to_live);
    poVar5 = _Mem::Output(CST_OUT);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&input);
    poVar5 = std::operator<<(poVar5,(string *)&input);
    poVar5 = std::operator<<(poVar5,"\t\t\t\t");
    (**(code **)((long)(pFVar3->super__Fact).super_LObject.
                       super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                       super__Object._vptr__Object + 0x10))(pFVar3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," pred icst[");
    (*((((this->super_HLPOverlay).super_Overlay.controller)->view->object).object)->_vptr__Object[2]
    )();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"][");
    std::__cxx11::string::~string((string *)&input);
    pPVar1 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar6 = (this->inputs).
                  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1)
    {
      input.object = pPVar6->object;
      if (input.object != (_Object *)0x0) {
        LOCK();
        ((input.object)->refCount).super___atomic_base<long>._M_i =
             ((input.object)->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      poVar5 = _Mem::Output(CST_OUT);
      poVar5 = std::operator<<(poVar5," ");
      (*(input.object)->_vptr__Object[2])();
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      core::P<r_exec::_Fact>::~P(&input);
    }
    poVar5 = _Mem::Output(CST_OUT);
  }
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void CSTOverlay::inject_production()
{
    Fact *f_icst = ((CSTController *)controller)->get_f_icst(bindings, &inputs);
    uint64_t now = Now(); //f_icst->get_reference(0)->trace();

    if (simulations.size() == 0) { // no simulation.
        uint64_t before = bindings->get_fwd_before();
        uint64_t time_to_live;

        if (now >= before) {
            time_to_live = 0;
        } else {
            time_to_live = before - now;
        }

        if (predictions.size()) {
            Pred *prediction = new Pred(f_icst, 1);
            Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
            std::unordered_set<P<_Fact>, PHash<_Fact> >::const_iterator pred;

            for (pred = predictions.begin(); pred != predictions.end(); ++pred) { // add antecedents to the prediction.
                prediction->grounds.push_back(*pred);
            }

            ((CSTController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd, time_to_live); // inject a f->pred->icst in the primary group, no rdx.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_p_f_icst->get_oid() << " pred icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << std::endl;
        } else {
            ((CSTController *)controller)->inject_icst(f_icst, lowest_cfd, time_to_live); // inject f->icst in the primary and secondary groups, and in the output groups.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_icst->get_oid() << " icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << "]" << std::endl;
        }
    } else { // there are simulations; the production is therefore a prediction; add the simulations to the latter.
        Pred *prediction = new Pred(f_icst, 1);
        Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
        std::unordered_set<P<Sim>, PHash<Sim> >::const_iterator sim;

        for (sim = simulations.begin(); sim != simulations.end(); ++sim) { // add simulations to the prediction.
            prediction->simulations.push_back(*sim);
        }

        ((HLPController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd); // inject a simulated prediction in the main group.
    }
}